

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined1 (*in_RCX) [64];
  long *in_RDX;
  Option *in_RSI;
  long *in_RDI;
  undefined1 auVar5 [64];
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  Option *in_stack_00000028;
  Mat top_blob_int32;
  int out_elempack_int32;
  int num_input;
  size_t out_elemsize;
  int out_elempack;
  bool use_int8_requantize;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  int channels;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Option opt_q;
  Mat bottom_blob_int8;
  int elembits;
  int in_stack_00000280;
  int in_stack_00000288;
  int in_stack_00000290;
  Option *in_stack_00000298;
  int in_stack_000002b0;
  int in_stack_000002b8;
  int in_stack_000002c0;
  Option *in_stack_000002c8;
  int in_stack_000009b0;
  int in_stack_000009b8;
  int in_stack_000009c0;
  Option *in_stack_000009c8;
  Option *in_stack_00000e00;
  Mat *in_stack_00000e08;
  Mat *in_stack_00000e10;
  Mat *in_stack_00000e18;
  Option *in_stack_000016b8;
  Mat *in_stack_000016c0;
  Mat *in_stack_000016c8;
  Mat *in_stack_000016d0;
  Option *in_stack_000018d8;
  Mat *in_stack_000018e0;
  Mat *in_stack_000018e8;
  Mat *in_stack_000018f0;
  Option *in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  Convolution *in_stack_fffffffffffffc80;
  int iVar6;
  size_t in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc94;
  undefined8 in_stack_fffffffffffffc98;
  void **ppvVar7;
  Mat *in_stack_fffffffffffffca0;
  bool local_335;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffcf4;
  undefined4 uVar9;
  Mat *top_blob_00;
  uint7 in_stack_fffffffffffffd00;
  undefined1 uVar10;
  int local_2dc;
  undefined1 local_2c8 [32];
  long *local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  int local_298;
  undefined4 local_294;
  int local_290;
  Option *in_stack_fffffffffffffd78;
  long lVar11;
  undefined4 in_stack_fffffffffffffd80;
  int iVar12;
  undefined4 in_stack_fffffffffffffd84;
  Mat *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int iVar13;
  void *local_240;
  Option *opt_00;
  Mat *bias_data;
  int iVar14;
  int iVar15;
  undefined4 in_stack_fffffffffffffddc;
  Mat *dst;
  int iVar16;
  int iVar17;
  int iVar18;
  int dilation_w;
  int kernel_h;
  int in_stack_fffffffffffffdfc;
  Mat *top_blob_01;
  Mat *in_stack_fffffffffffffe08;
  Mat *in_stack_fffffffffffffe10;
  undefined8 uStack_1e0;
  undefined1 local_1e8 [64];
  void *local_1a0;
  Allocator *local_198;
  Allocator *local_190;
  int local_188;
  long *local_180;
  undefined4 local_178;
  undefined4 local_174;
  int local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined8 local_160;
  int local_154;
  undefined1 (*local_150) [64];
  long *local_148;
  int local_12c;
  int iVar19;
  undefined1 *puVar20;
  Mat *in_stack_fffffffffffffee8;
  Mat *in_stack_fffffffffffffef0;
  Mat *in_stack_fffffffffffffef8;
  Mat *in_stack_ffffffffffffff70;
  Option *opt_01;
  long *plVar21;
  int stride_w;
  Mat *pMVar22;
  int stride_h;
  Option *opt_02;
  
  if (in_RSI->openmp_blocktime == 0) {
    local_2dc = 0;
  }
  else {
    uVar3 = (long)in_RSI->workspace_allocator << 3;
    local_2dc = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                     (long)in_RSI->openmp_blocktime);
  }
  local_154 = local_2dc;
  local_1a0 = *(void **)in_RSI;
  local_198 = in_RSI->blob_allocator;
  local_190 = in_RSI->workspace_allocator;
  local_188 = in_RSI->openmp_blocktime;
  local_180 = *(long **)&in_RSI->use_bf16_storage;
  local_178._0_1_ = in_RSI->use_shader_pack8;
  local_178._1_1_ = in_RSI->use_subgroup_basic;
  local_178._2_1_ = in_RSI->use_subgroup_vote;
  local_178._3_1_ = in_RSI->use_subgroup_ballot;
  local_174._0_1_ = in_RSI->use_subgroup_shuffle;
  local_174._1_1_ = in_RSI->use_image_storage;
  local_174._2_1_ = in_RSI->use_tensor_storage;
  local_174._3_1_ = in_RSI->use_reserved_0;
  local_170 = in_RSI->flush_denormals;
  local_16c._0_1_ = in_RSI->use_local_pool_allocator;
  local_16c._1_1_ = in_RSI->use_shader_local_memory;
  local_16c._2_1_ = in_RSI->use_cooperative_matrix;
  local_16c._3_1_ = in_RSI->use_winograd23_convolution;
  local_168._0_1_ = in_RSI->use_winograd43_convolution;
  local_168._1_1_ = in_RSI->use_winograd63_convolution;
  local_168._2_1_ = in_RSI->use_a53_a55_optimized_kernel;
  local_168._3_1_ = in_RSI->use_reserved_7;
  local_160._0_1_ = in_RSI[1].lightmode;
  local_160._1_3_ = *(undefined3 *)&in_RSI[1].field_0x1;
  local_160._4_4_ = in_RSI[1].num_threads;
  if (local_198 != (Allocator *)0x0) {
    LOCK();
    *(int *)&local_198->_vptr_Allocator = *(int *)&local_198->_vptr_Allocator + 1;
    UNLOCK();
  }
  local_150 = in_RCX;
  local_148 = in_RDX;
  opt_02 = in_RSI;
  if (local_2dc != 8) {
    auVar5 = vmovdqu64_avx512f(*in_RCX);
    auVar5 = vmovdqu64_avx512f(auVar5);
    local_1e8._16_48_ = auVar5._16_48_;
    local_1e8._0_8_ = auVar5._0_8_;
    uStack_1e0 = *(undefined8 *)(*in_RCX + 0x10);
    quantize_to_int8((Mat *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88,
                     (Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd78);
  }
  stride_h = (int)in_RSI;
  iVar19 = (int)((ulong)&local_240 >> 0x20);
  local_240 = (void *)0x0;
  opt_00 = (Option *)0x0;
  bias_data = (Mat *)0x0;
  iVar14 = 0;
  dst = (Mat *)0x0;
  iVar16 = 0;
  iVar17 = 0;
  iVar18 = 0;
  dilation_w = 0;
  iVar2 = 0;
  top_blob_01 = (Mat *)0x0;
  Convolution::make_padding
            (in_stack_fffffffffffffc80,
             (Mat *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  iVar6 = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  top_blob_00 = (Mat *)&local_240;
  uVar10 = local_240 == (void *)0x0 || (long)top_blob_01 * (long)iVar2 == 0;
  uVar9 = CONCAT13(uVar10,(int3)in_stack_fffffffffffffcf4);
  if ((bool)uVar10) {
    local_12c = -100;
  }
  else {
    iVar4 = (iVar18 - (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1)) /
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) + 1;
    bVar1 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) < 0x65;
    iVar13 = 1;
    if (((*local_150)[0x27] & 1) != 0) {
      if (bVar1) {
        iVar13 = 1;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
          iVar13 = 4;
        }
      }
      else {
        iVar13 = 1;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
          iVar13 = 8;
        }
      }
    }
    if (bVar1) {
      iVar13 = iVar13 << 2;
    }
    iVar15 = iVar14;
    kernel_h = iVar2;
    pMVar22 = top_blob_00;
    Mat::create(in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                (int)in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc88,
                iVar6,(Allocator *)(ulong)in_stack_fffffffffffffd00);
    stride_w = (int)pMVar22;
    uVar8 = CONCAT13(1,(int3)in_stack_fffffffffffffce8);
    if (*local_148 != 0) {
      uVar8 = CONCAT13(local_148[8] * (long)(int)local_148[7] == 0,(int3)in_stack_fffffffffffffce8);
    }
    if ((char)((uint)uVar8 >> 0x18) == '\0') {
      iVar2 = iVar2 * iVar14;
      iVar12 = 1;
      if ((((*local_150)[0x27] & 1) != 0) &&
         (iVar12 = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0)) {
        iVar12 = 4;
      }
      puVar20 = local_2c8;
      local_2c8._0_8_ = (void *)0x0;
      local_2c8._8_8_ = (Allocator *)0x0;
      local_2c8._16_8_ = (Allocator *)0x0;
      local_2c8._24_4_ = 0;
      local_2a8 = (long *)0x0;
      local_2a0._0_1_ = false;
      local_2a0._1_1_ = false;
      local_2a0._2_1_ = false;
      local_2a0._3_1_ = false;
      local_29c._0_1_ = false;
      local_29c._1_1_ = false;
      local_29c._2_1_ = false;
      local_29c._3_1_ = false;
      local_298 = 0;
      local_294._0_1_ = false;
      local_294._1_1_ = false;
      local_294._2_1_ = false;
      local_294._3_1_ = false;
      local_290 = 0;
      lVar11 = 0;
      plVar21 = local_148;
      Mat::create(in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                  (int)in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc88
                  ,iVar6,(Allocator *)CONCAT17(uVar10,in_stack_fffffffffffffd00));
      iVar6 = (int)plVar21;
      opt_01 = (Option *)local_2c8;
      local_335 = (void *)local_2c8._0_8_ == (void *)0x0 || lVar11 * local_290 == 0;
      if (local_335) {
        local_12c = -100;
      }
      else {
        if ((iVar14 == 8) && (iVar12 == 4)) {
          if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
             ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            conv1x1s1_sgemm_pack8to4_int8_sse
                      ((Mat *)CONCAT17(uVar10,in_stack_fffffffffffffd00),top_blob_00,
                       (Mat *)CONCAT44(uVar9,iVar13),(Option *)CONCAT44(iVar4,uVar8));
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            conv1x1s2_sgemm_pack8to4_int8_sse
                      (in_stack_fffffffffffffe08,top_blob_01,
                       (Mat *)CONCAT44(in_stack_fffffffffffffdfc,kernel_h),
                       (Option *)CONCAT44(dilation_w,iVar18));
          }
          else if ((((*local_150)[0x1c] & 1) == 0) ||
                  (((((((*local_150)[0x38] & 1) == 0 ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3)) ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3)) ||
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1)))) ||
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1 ||
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))))) {
            if (((*local_150)[0x1d] & 1) == 0) {
              convolution_pack8to4_int8_sse
                        ((Mat *)bottom_blob_bordered.data,_w,_channels,elempack,kernel_extent_w,
                         kernel_extent_h,in_stack_000009b0,in_stack_000009b8,in_stack_000009c0,
                         in_stack_000009c8);
            }
            else {
              convolution_im2col_sgemm_pack8to4_int8_sse
                        (local_1e8._0_8_,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         (int)((ulong)top_blob_01 >> 0x20),(int)top_blob_01,
                         in_stack_fffffffffffffdfc,in_stack_00000010,in_stack_00000018,
                         in_stack_00000020,in_stack_00000028);
            }
          }
          else {
            conv3x3s1_winograd43_pack8to4_int8_sse
                      (in_stack_000018f0,in_stack_000018e8,in_stack_000018e0,in_stack_000018d8);
          }
        }
        if ((iVar14 == 1) && (iVar12 == 4)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            conv1x1s1_sgemm_pack1to4_int8_sse
                      ((Mat *)CONCAT17(uVar10,in_stack_fffffffffffffd00),top_blob_00,
                       (Mat *)CONCAT44(uVar9,iVar13),(Option *)CONCAT44(iVar4,uVar8));
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            conv1x1s2_sgemm_pack1to4_int8_sse
                      (in_stack_fffffffffffffe08,top_blob_01,
                       (Mat *)CONCAT44(in_stack_fffffffffffffdfc,kernel_h),
                       (Option *)CONCAT44(dilation_w,iVar18));
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                  ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            conv3x3s1_pack1to4_int8_sse
                      (in_stack_fffffffffffffe08,top_blob_01,
                       (Mat *)CONCAT44(in_stack_fffffffffffffdfc,kernel_h),
                       (Option *)CONCAT44(dilation_w,iVar18));
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)))) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            conv3x3s2_pack1to4_int8_sse
                      (in_stack_fffffffffffffe08,top_blob_01,
                       (Mat *)CONCAT44(in_stack_fffffffffffffdfc,kernel_h),
                       (Option *)CONCAT44(dilation_w,iVar18));
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 7) &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 7 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))) {
            conv7x7s2_pack1to4_int8_sse
                      (in_stack_fffffffffffffe08,top_blob_01,
                       (Mat *)CONCAT44(in_stack_fffffffffffffdfc,kernel_h),
                       (Option *)CONCAT44(dilation_w,iVar18));
          }
          else if (((*local_150)[0x1d] & 1) == 0) {
            convolution_pack1to4_int8_sse
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                       ,(int)((ulong)puVar20 >> 0x20),(int)puVar20,iVar19,in_stack_00000280,
                       in_stack_00000288,in_stack_00000290,in_stack_00000298);
          }
          else {
            convolution_im2col_sgemm_pack1to4_int8_sse
                      (local_1e8._0_8_,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (int)((ulong)top_blob_01 >> 0x20),(int)top_blob_01,in_stack_fffffffffffffdfc,
                       in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028);
          }
        }
        if ((iVar14 == 8) && (iVar12 == 1)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            conv1x1s1_sgemm_pack8to1_int8_sse
                      ((Mat *)CONCAT17(uVar10,in_stack_fffffffffffffd00),top_blob_00,
                       (Mat *)CONCAT44(uVar9,iVar13),(Option *)CONCAT44(iVar4,uVar8));
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            conv1x1s2_sgemm_pack8to1_int8_sse
                      (in_stack_fffffffffffffe08,top_blob_01,
                       (Mat *)CONCAT44(in_stack_fffffffffffffdfc,kernel_h),
                       (Option *)CONCAT44(dilation_w,iVar18));
          }
          else if ((((*local_150)[0x1c] & 1) == 0) ||
                  ((((((((*local_150)[0x38] & 1) == 0 ||
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3)) ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3)) ||
                     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1)))) ||
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1)) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))) {
            if (((*local_150)[0x1d] & 1) == 0) {
              convolution_pack8to1_int8_sse
                        (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8,(int)((ulong)puVar20 >> 0x20),(int)puVar20,iVar19
                         ,in_stack_000002b0,in_stack_000002b8,in_stack_000002c0,in_stack_000002c8);
            }
            else {
              convolution_im2col_sgemm_pack8to1_int8_sse
                        (local_1e8._0_8_,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         (int)((ulong)top_blob_01 >> 0x20),(int)top_blob_01,
                         in_stack_fffffffffffffdfc,in_stack_00000010,in_stack_00000018,
                         in_stack_00000020,in_stack_00000028);
            }
          }
          else {
            conv3x3s1_winograd43_pack8to1_int8_sse
                      (in_stack_000016d0,in_stack_000016c8,in_stack_000016c0,in_stack_000016b8);
          }
        }
        if ((iVar14 == 1) && (iVar12 == 1)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            conv1x1s1_sgemm_int8_sse
                      ((Mat *)CONCAT17(uVar10,in_stack_fffffffffffffd00),top_blob_00,
                       (Mat *)CONCAT44(uVar9,iVar13),(Option *)CONCAT44(iVar4,uVar8));
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            conv1x1s2_sgemm_int8_sse
                      (in_stack_fffffffffffffe08,top_blob_01,
                       (Mat *)CONCAT44(in_stack_fffffffffffffdfc,kernel_h),
                       (Option *)CONCAT44(dilation_w,iVar18));
          }
          else if (((((*local_150)[0x1c] & 1) == 0) ||
                   (((((*local_150)[0x37] & 1) == 0 ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3)) ||
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3)))) ||
                  ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1)) ||
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1 ||
                     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1 ||
                      (iVar2 < 0x10)))))) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10)))) {
            if (((*local_150)[0x1d] & 1) == 0) {
              convolution_int8(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,top_blob_01,
                               in_stack_fffffffffffffdfc,kernel_h,dilation_w,iVar6,stride_w,stride_h
                               ,opt_02);
            }
            else {
              convolution_im2col_sgemm_int8_sse
                        (local_1e8._0_8_,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         (int)((ulong)top_blob_01 >> 0x20),(int)top_blob_01,
                         in_stack_fffffffffffffdfc,in_stack_00000010,in_stack_00000018,
                         in_stack_00000020,in_stack_00000028);
            }
          }
          else {
            conv3x3s1_winograd23_int8_sse
                      (in_stack_00000e18,in_stack_00000e10,in_stack_00000e08,in_stack_00000e00);
          }
        }
        if (bVar1) {
          dequantize_from_int32
                    ((Mat *)CONCAT44(iVar17,iVar16),dst,
                     (Mat *)CONCAT44(in_stack_fffffffffffffddc,iVar15),bias_data,opt_00);
          if (in_RDI[1] != 0) {
            (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_148,local_150);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (local_1e8._56_8_,local_1e8._48_8_,local_1e8._40_8_,local_1e8._32_8_,
                     local_1e8._24_8_,local_1e8._20_4_,in_stack_ffffffffffffff70,opt_01);
        }
        local_12c = 0;
      }
      if ((Allocator *)local_2c8._8_8_ != (Allocator *)0x0) {
        LOCK();
        iVar19 = *(int *)(_func_int ***)local_2c8._8_8_;
        *(int *)(_func_int ***)local_2c8._8_8_ = *(int *)(_func_int ***)local_2c8._8_8_ + -1;
        UNLOCK();
        if (iVar19 == 1) {
          if (local_2a8 == (long *)0x0) {
            if ((void *)local_2c8._0_8_ != (void *)0x0) {
              free((void *)local_2c8._0_8_);
            }
          }
          else {
            (**(code **)(*local_2a8 + 0x18))(local_2a8,local_2c8._0_8_);
          }
        }
      }
      local_2c8[0] = false;
      local_2c8._1_3_ = 0;
      local_2c8._4_4_ = 0;
      local_2c8._16_8_ = (Allocator *)0x0;
      local_2c8._24_4_ = 0;
      local_2a0._0_1_ = false;
      local_2a0._1_1_ = false;
      local_2a0._2_1_ = false;
      local_2a0._3_1_ = false;
      local_29c._0_1_ = false;
      local_29c._1_1_ = false;
      local_29c._2_1_ = false;
      local_29c._3_1_ = false;
      local_298 = 0;
      local_294._0_1_ = false;
      local_294._1_1_ = false;
      local_294._2_1_ = false;
      local_294._3_1_ = false;
      local_290._0_1_ = false;
      local_290._1_1_ = false;
      local_290._2_1_ = false;
      local_290._3_1_ = false;
      local_2c8._8_8_ = (Allocator *)0x0;
    }
    else {
      local_12c = -100;
    }
  }
  ppvVar7 = &local_240;
  if (opt_00 != (Option *)0x0) {
    LOCK();
    iVar19 = *(int *)opt_00;
    *(int *)opt_00 = *(int *)opt_00 + -1;
    UNLOCK();
    if (iVar19 == 1) {
      if (dst == (Mat *)0x0) {
        if (local_240 != (void *)0x0) {
          free(local_240);
        }
      }
      else {
        (**(code **)((long)dst->data + 0x18))(dst,local_240);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
  ppvVar7 = &local_1a0;
  if (local_198 != (Allocator *)0x0) {
    LOCK();
    iVar19 = *(int *)&local_198->_vptr_Allocator;
    *(int *)&local_198->_vptr_Allocator = *(int *)&local_198->_vptr_Allocator + -1;
    UNLOCK();
    if (iVar19 == 1) {
      if (local_180 == (long *)0x0) {
        if (local_1a0 != (void *)0x0) {
          free(local_1a0);
        }
      }
      else {
        (**(code **)(*local_180 + 0x18))(local_180,local_1a0);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
  return local_12c;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}